

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

seq_t * rdr_readseq(rdr_t *rdr,FILE *file,_Bool lbl)

{
  raw_t *raw;
  seq_t *psVar1;
  
  raw = rdr_readraw(rdr,file);
  if (raw == (raw_t *)0x0) {
    psVar1 = (seq_t *)0x0;
  }
  else {
    psVar1 = rdr_raw2seq(rdr,raw,lbl);
    rdr_freeraw(raw);
  }
  return psVar1;
}

Assistant:

seq_t *rdr_readseq(rdr_t *rdr, FILE *file, bool lbl) {
	raw_t *raw = rdr_readraw(rdr, file);
	if (raw == NULL)
		return NULL;
	seq_t *seq = rdr_raw2seq(rdr, raw, lbl);
	rdr_freeraw(raw);
	return seq;
}